

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusArcIntersect.cpp
# Opt level: O2

int GeoCalcs::LocusArcIntersect
              (Locus *locus,LLPoint *arcCenter,double arcRadius,LLPoint *intersection1,
              LLPoint *intersection2,double dTol,double dEps)

{
  double dCrs13;
  double dVar1;
  bool bVar2;
  int iVar3;
  LLPoint *pLVar4;
  int iVar5;
  LLPoint LVar6;
  int local_13c;
  double newDistbase;
  int local_120;
  int local_11c;
  double errarray [2];
  LLPoint local_f8;
  double distarray [2];
  InverseResult result;
  LLPoint intPt2;
  LLPoint intPt1;
  LLPoint local_78;
  LLPoint perpPt;
  LLPoint intPt;
  double dDistFromPt;
  double dCrsFromPt;
  
  result.distance = 0.0;
  result.azimuth = 0.0;
  result.reverseAzimuth = 0.0;
  DistVincenty(&locus->locusStart,&locus->locusEnd,&result);
  intPt1.latitude = 0.0;
  intPt1.longitude = 0.0;
  intPt2.latitude = 0.0;
  intPt2.longitude = 0.0;
  iVar3 = GeodesicArcIntercept
                    (&locus->locusStart,result.azimuth,arcCenter,arcRadius,&intPt1,&intPt2,dTol);
  local_120 = AdjustIntersects(iVar3,locus,&intPt1,&intPt2);
  if (local_120 == 0) {
    local_13c = 0;
  }
  else {
    DistVincenty(&locus->geoStart,&locus->geoEnd,&result);
    dCrs13 = result.azimuth;
    iVar3 = 0;
    local_11c = 0;
    if (0 < local_120) {
      local_11c = local_120;
    }
    local_13c = 0;
    for (; iVar3 != local_11c; iVar3 = iVar3 + 1) {
      pLVar4 = &intPt2;
      if (iVar3 == 0) {
        pLVar4 = &intPt1;
      }
      intPt.latitude = pLVar4->latitude;
      intPt.longitude = pLVar4->longitude;
      LVar6 = PerpIntercept(&locus->geoStart,dCrs13,&intPt,&dCrsFromPt,&dDistFromPt,dTol);
      perpPt.longitude = LVar6.longitude;
      perpPt.latitude = LVar6.latitude;
      DistVincenty(&perpPt,&locus->geoStart,&result);
      dVar1 = result.distance;
      LVar6 = PointOnLocusP(locus,&perpPt,dTol,dEps);
      local_f8.longitude = LVar6.longitude;
      local_f8.latitude = LVar6.latitude;
      DistVincenty(&local_f8,arcCenter,&result);
      errarray[1] = result.distance - arcRadius;
      if (dTol <= ABS(errarray[1])) {
        distarray[1] = dVar1;
        newDistbase = dVar1 * 1.001;
        iVar5 = 0xf;
        while (((bVar2 = iVar5 != 0, iVar5 = iVar5 + -1, bVar2 && (!NAN(newDistbase))) &&
               (dTol < ABS(errarray[1])))) {
          LVar6 = DestVincenty(&locus->geoStart,dCrs13,newDistbase);
          local_78.longitude = LVar6.longitude;
          local_78.latitude = LVar6.latitude;
          LVar6 = PointOnLocusP(locus,&local_78,dTol,dEps);
          local_f8.longitude = LVar6.longitude;
          local_f8.latitude = LVar6.latitude;
          DistVincenty(&local_f8,arcCenter,&result);
          distarray[0] = distarray[1];
          distarray[1] = newDistbase;
          errarray[0] = errarray[1];
          errarray[1] = result.distance - arcRadius;
          FindLinearRoot(distarray,errarray,&newDistbase);
        }
      }
      bVar2 = PtIsOnLocus(locus,&local_f8,1e-06);
      if (bVar2) {
        pLVar4 = &intPt1;
        if ((iVar3 == 0) || (pLVar4 = &intPt2, iVar3 == 1)) {
          pLVar4->latitude = local_f8.latitude;
          pLVar4->longitude = local_f8.longitude;
        }
        local_13c = local_13c + 1;
      }
    }
    intersection1->latitude = intPt1.latitude;
    intersection1->longitude = intPt1.longitude;
    intersection2->latitude = intPt2.latitude;
    intersection2->longitude = intPt2.longitude;
    DistVincenty(intersection1,intersection2,&result);
    if ((local_120 == 2) && (ABS(result.distance) < 5e-09)) {
      local_13c = 1;
    }
  }
  return local_13c;
}

Assistant:

int LocusArcIntersect(const Locus &locus, const LLPoint &arcCenter, double arcRadius,
                          LLPoint &intersection1, LLPoint &intersection2, double dTol,
                          double dEps)
    {
        int nIntersections = 0;

        InverseResult result;
        DistVincenty(locus.locusStart, locus.locusEnd, result);

        LLPoint intPt1, intPt2;

        const int nIntersects = AdjustIntersects(GeodesicArcIntercept(locus.locusStart, result.azimuth,
                                                                      arcCenter, arcRadius, intPt1, intPt2,
                                                                      dTol),
                                                 locus, intPt1, intPt2);

        if (nIntersects == 0)
            return 0;

        DistVincenty(locus.geoStart, locus.geoEnd, result);
        const double gcrs = result.azimuth;

        for (int i = 0; i < nIntersects; i++)
        {
            LLPoint intPt = i == 0 ? intPt1 : intPt2;
            double dCrsFromPt, dDistFromPt;
            LLPoint perpPt = PerpIntercept(locus.geoStart, gcrs, intPt, dCrsFromPt, dDistFromPt, dTol);

            DistVincenty(perpPt, locus.geoStart, result);
            const double distbase = result.distance;

            LLPoint locPt = PointOnLocusP(locus, perpPt, dTol, dEps);

            DistVincenty(locPt, arcCenter, result);

            double errarray[2], distarray[2];
            errarray[1] = result.distance - arcRadius;

            if (fabs(errarray[1]) >= dTol)
            {
                distarray[1] = distbase;
                const int maxCount = 15;
                double newDistbase = 1.001 * distbase;
                int k = 0;
                while (k < maxCount && !std::isnan(newDistbase) && fabs(errarray[1]) > dTol)
                {
                    locPt = PointOnLocusP(locus, DestVincenty(locus.geoStart, gcrs, newDistbase),
                                          dTol, dEps);
                    DistVincenty(locPt, arcCenter, result);

                    distarray[0] = distarray[1];
                    distarray[1] = newDistbase;
                    errarray[0] = errarray[1];
                    errarray[1] = result.distance - arcRadius;

                    FindLinearRoot(distarray, errarray, newDistbase);
                    k++;
                }
            }

            if (PtIsOnLocus(locus, locPt, 1e-6)) //dTol))
            {
                if (i == 0)
                    intPt1 = locPt;
                else if (i == 1)
                    intPt2 = locPt;
                nIntersections++;
            }
        }
        intersection1 = intPt1;
        intersection2 = intPt2;
        DistVincenty(intersection1, intersection2, result);
        if (nIntersects == 2 && IsNearZero(result.distance, 0.5e-8))
        {
            nIntersections = 1;
        }

        return nIntersections;
    }